

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Periodicity.cpp
# Opt level: O2

vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> * __thiscall
amrex::Periodicity::shiftIntVect
          (vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *__return_storage_ptr__,
          Periodicity *this)

{
  int iVar1;
  int iVar2;
  int i;
  long lVar3;
  int iVar4;
  int j;
  int iVar5;
  int iVar6;
  int jmp [3];
  int per [3];
  int local_70 [4];
  int local_60 [4];
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  IntVect local_3c;
  
  (__return_storage_ptr__->super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60[2] = 0;
  (__return_storage_ptr__->super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60[0] = 0;
  local_60[1] = 0;
  local_70[0] = 1;
  local_70[1] = 1;
  local_70[2] = 1;
  for (lVar3 = 0; iVar2 = local_60[2], iVar1 = local_70[2], lVar3 != 3; lVar3 = lVar3 + 1) {
    iVar1 = (this->period).vect[lVar3];
    if (0 < iVar1) {
      local_70[lVar3] = iVar1;
      local_60[lVar3] = iVar1;
    }
  }
  local_4c = local_60[0];
  local_40 = local_60[1];
  local_50 = -local_60[1];
  local_44 = -local_60[2];
  local_60[3] = local_70[0];
  local_48 = local_70[1];
  for (iVar4 = -local_60[0]; iVar5 = local_50, iVar4 <= local_4c; iVar4 = iVar4 + local_60[3]) {
    for (; iVar6 = local_44, iVar5 <= local_40; iVar5 = iVar5 + local_48) {
      for (; iVar6 <= iVar2; iVar6 = iVar6 + iVar1) {
        local_3c.vect[0] = iVar4;
        local_3c.vect[1] = iVar5;
        local_3c.vect[2] = iVar6;
        std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::emplace_back<amrex::IntVect>
                  (__return_storage_ptr__,&local_3c);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<IntVect>
Periodicity::shiftIntVect () const
{
    std::vector<IntVect> r;

    int per[3] = {0,0,0};
    int jmp[3] = {1,1,1};

    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (isPeriodic(i)) {
            per[i] = jmp[i] = period[i];
        }
    }

    for (int i = -per[0]; i <= per[0]; i += jmp[0]) {
    for (int j = -per[1]; j <= per[1]; j += jmp[1]) {
    for (int k = -per[2]; k <= per[2]; k += jmp[2]) {
        r.push_back(IntVect(AMREX_D_DECL(i,j,k)));
    }
    }
    }

    return r;
}